

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O1

Ref<glTF::Accessor>
ExportData(Asset *a,string *meshName,Ref<glTF::Buffer> *buffer,uint count,void *data,Value typeIn,
          Value typeOut,ComponentType compType,bool isIndices)

{
  LazyDict<glTF::BufferView> *this;
  LazyDict<glTF::Accessor> *this_00;
  pointer *ppfVar1;
  int iVar2;
  Buffer *pBVar3;
  void *__src;
  BufferView *pBVar4;
  Accessor *pAVar5;
  iterator iVar6;
  ulong uVar7;
  void *__dest;
  vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *pvVar8;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar9;
  runtime_error *this_01;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  __shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *p_Var14;
  float *pfVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  float fVar19;
  Ref<glTF::BufferView> RVar20;
  Ref<glTF::Accessor> RVar21;
  string local_90;
  float local_6c;
  Asset *local_68;
  string *local_60;
  __shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  Ref<glTF::Buffer> *local_38;
  
  if (data == (void *)0x0 || count == 0) {
    pvVar9 = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0;
    uVar10 = 0;
  }
  else {
    if ((6 < compType - ComponentType_BYTE) || ((0x6fU >> (compType & 0x1f) & 1) == 0)) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"GLTF: Unsupported Component Type ","");
      std::__cxx11::string::push_back((char)&local_90);
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&local_90);
      *(undefined ***)this_01 = &PTR__runtime_error_00900168;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48 = (ulong)*(uint *)(&DAT_009da1d8 + (ulong)typeIn * 0x10);
    iVar2 = *(int *)(&DAT_009da1d8 + (ulong)typeOut * 0x10);
    local_50 = (ulong)*(uint *)(&DAT_007c0c9c + (ulong)(compType - ComponentType_BYTE) * 4);
    pBVar3 = (buffer->vector->super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>).
             _M_impl.super__Vector_impl_data._M_start[buffer->index];
    uVar10 = pBVar3->byteLength;
    uVar18 = local_50 - 1 & uVar10;
    local_40 = (ulong)(iVar2 * count *
                      *(uint *)(&DAT_007c0c9c + (ulong)(compType - ComponentType_BYTE) * 4));
    lVar17 = uVar18 + local_40;
    local_68 = a;
    local_60 = meshName;
    local_38 = buffer;
    if (lVar17 != 0) {
      uVar13 = pBVar3->capacity;
      uVar7 = uVar10 + lVar17;
      if (uVar13 < uVar7) {
        uVar13 = (uVar13 >> 1) + uVar13;
        if (uVar13 <= uVar7) {
          uVar13 = uVar7;
        }
        pBVar3->capacity = uVar13;
        __dest = operator_new__(uVar13);
        __src = (pBVar3->mData).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        p_Var14 = (__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&pBVar3->mData;
        if (__src != (void *)0x0) {
          local_58 = (__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&pBVar3->mData;
          memcpy(__dest,__src,uVar10);
          p_Var14 = local_58;
        }
        std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
        reset<unsigned_char,std::default_delete<unsigned_char[]>>(p_Var14,__dest);
        uVar7 = lVar17 + pBVar3->byteLength;
      }
      pBVar3->byteLength = uVar7;
    }
    this = &local_68->bufferViews;
    glTF::Asset::FindUniqueID(&local_90,local_68,local_60,"view");
    RVar20 = glTF::LazyDict<glTF::BufferView>::Create(this,local_90._M_dataplus._M_p);
    pvVar8 = RVar20.vector;
    uVar11 = RVar20.index;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    pBVar4 = (pvVar8->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar11];
    (pBVar4->buffer).index = local_38->index;
    (pBVar4->buffer).vector = local_38->vector;
    (pvVar8->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar11]->byteOffset = uVar18 + uVar10 & 0xffffffff;
    (pvVar8->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar11]->byteLength = local_40;
    (pvVar8->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar11]->target = isIndices | BufferViewTarget_ARRAY_BUFFER;
    this_00 = &local_68->accessors;
    glTF::Asset::FindUniqueID(&local_90,local_68,local_60,"accessor");
    RVar21 = glTF::LazyDict<glTF::Accessor>::Create(this_00,local_90._M_dataplus._M_p);
    pvVar9 = RVar21.vector;
    uVar12 = RVar21.index;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    pAVar5 = (pvVar9->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar12];
    (pAVar5->bufferView).vector = pvVar8;
    (pAVar5->bufferView).index = uVar11;
    (pvVar9->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar12]->byteOffset = 0;
    (pvVar9->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar12]->byteStride = 0;
    (pvVar9->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar12]->componentType = compType;
    (pvVar9->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar12]->count = count;
    (pvVar9->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar12]->type = typeOut;
    local_90._M_dataplus._M_p._0_4_ = 1e+13;
    iVar16 = iVar2 + (uint)(iVar2 == 0);
    do {
      pAVar5 = (pvVar9->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar12];
      iVar6._M_current =
           *(pointer *)
            ((long)&(pAVar5->min).super__Vector_base<float,_std::allocator<float>_>._M_impl + 8);
      if (iVar6._M_current ==
          *(pointer *)
           ((long)&(pAVar5->min).super__Vector_base<float,_std::allocator<float>_>._M_impl + 0x10))
      {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&pAVar5->min,iVar6,(float *)&local_90);
      }
      else {
        *iVar6._M_current = local_90._M_dataplus._M_p._0_4_;
        ppfVar1 = (pointer *)
                  ((long)&(pAVar5->min).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  8);
        *ppfVar1 = *ppfVar1 + 1;
      }
      pAVar5 = (pvVar9->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar12];
      local_6c = -local_90._M_dataplus._M_p._0_4_;
      iVar6._M_current =
           *(pointer *)
            ((long)&(pAVar5->max).super__Vector_base<float,_std::allocator<float>_>._M_impl + 8);
      if (iVar6._M_current ==
          *(pointer *)
           ((long)&(pAVar5->max).super__Vector_base<float,_std::allocator<float>_>._M_impl + 0x10))
      {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&pAVar5->max,iVar6,&local_6c);
      }
      else {
        *iVar6._M_current = local_6c;
        ppfVar1 = (pointer *)
                  ((long)&(pAVar5->max).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  8);
        *ppfVar1 = *ppfVar1 + 1;
      }
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    uVar10 = 0;
    do {
      uVar18 = 0;
      do {
        if (typeOut == SCALAR) {
          fVar19 = (float)*(ushort *)((long)data + uVar10 * 2);
        }
        else {
          pfVar15 = (float *)((long)data + uVar10 * 0xc + 8);
          if (((int)uVar18 != 2) &&
             (pfVar15 = (float *)((long)data + uVar10 * 0xc), (int)uVar18 == 1)) {
            pfVar15 = (float *)((long)data + uVar10 * 0xc + 4);
          }
          fVar19 = *pfVar15;
        }
        lVar17 = *(long *)&((pvVar9->
                            super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)
                            ._M_impl.super__Vector_impl_data._M_start[uVar12]->min).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data;
        if (fVar19 < *(float *)(lVar17 + uVar18 * 4)) {
          *(float *)(lVar17 + uVar18 * 4) = fVar19;
        }
        lVar17 = *(long *)&((pvVar9->
                            super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)
                            ._M_impl.super__Vector_impl_data._M_start[uVar12]->max).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data;
        pfVar15 = (float *)(lVar17 + uVar18 * 4);
        if (*pfVar15 <= fVar19 && fVar19 != *pfVar15) {
          *(float *)(lVar17 + uVar18 * 4) = fVar19;
        }
        uVar18 = uVar18 + 1;
      } while (iVar2 + (uint)(iVar2 == 0) != uVar18);
      uVar10 = uVar10 + 1;
    } while (uVar10 != count + (count == 0));
    glTF::Accessor::WriteData
              ((pvVar9->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar12],(ulong)count,data,
               (ulong)(uint)((int)local_48 * (int)local_50));
    uVar10 = (ulong)uVar12;
  }
  RVar21._8_8_ = uVar10;
  RVar21.vector = pvVar9;
  return RVar21;
}

Assistant:

inline Ref<Accessor> ExportData(Asset& a, std::string& meshName, Ref<Buffer>& buffer,
    unsigned int count, void* data, AttribType::Value typeIn, AttribType::Value typeOut, ComponentType compType, bool isIndices = false)
{
    if (!count || !data) return Ref<Accessor>();

    unsigned int numCompsIn = AttribType::GetNumComponents(typeIn);
    unsigned int numCompsOut = AttribType::GetNumComponents(typeOut);
    unsigned int bytesPerComp = ComponentTypeSize(compType);

    size_t offset = buffer->byteLength;
    // make sure offset is correctly byte-aligned, as required by spec
    size_t padding = offset % bytesPerComp;
    offset += padding;
    size_t length = count * numCompsOut * bytesPerComp;
    buffer->Grow(length + padding);

    // bufferView
    Ref<BufferView> bv = a.bufferViews.Create(a.FindUniqueID(meshName, "view"));
    bv->buffer = buffer;
    bv->byteOffset = unsigned(offset);
    bv->byteLength = length; //! The target that the WebGL buffer should be bound to.
    bv->target = isIndices ? BufferViewTarget_ELEMENT_ARRAY_BUFFER : BufferViewTarget_ARRAY_BUFFER;

    // accessor
    Ref<Accessor> acc = a.accessors.Create(a.FindUniqueID(meshName, "accessor"));
    acc->bufferView = bv;
    acc->byteOffset = 0;
    acc->byteStride = 0;
    acc->componentType = compType;
    acc->count = count;
    acc->type = typeOut;

    // calculate min and max values
    {
        // Allocate and initialize with large values.
        float float_MAX = 10000000000000.0f;
        for (unsigned int i = 0 ; i < numCompsOut ; i++) {
            acc->min.push_back( float_MAX);
            acc->max.push_back(-float_MAX);
        }

        // Search and set extreme values.
        float valueTmp;
        for (unsigned int i = 0 ; i < count       ; i++) {
            for (unsigned int j = 0 ; j < numCompsOut ; j++) {
                if (numCompsOut == 1) {
                  valueTmp = static_cast<unsigned short*>(data)[i];
                } else {
                  valueTmp = static_cast<aiVector3D*>(data)[i][j];
                }

                if (valueTmp < acc->min[j]) {
                    acc->min[j] = valueTmp;
                }
                if (valueTmp > acc->max[j]) {
                    acc->max[j] = valueTmp;
                }
            }
        }
    }

    // copy the data
    acc->WriteData(count, data, numCompsIn*bytesPerComp);

    return acc;
}